

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_scan_line(Parser *this)

{
  char *s_;
  char *pcVar1;
  ulong uVar2;
  code *pcVar3;
  csubstr full_;
  bool bVar4;
  ulong uVar5;
  size_t len_;
  ulong uVar6;
  long lVar7;
  LineContents *this_00;
  ulong uVar8;
  char *pcVar9;
  csubstr full__00;
  csubstr stripped_;
  csubstr stripped__00;
  basic_substring<const_char> bStack_78;
  undefined8 uStack_68;
  csubstr cStack_60;
  ulong uStack_50;
  LineContents *pLStack_48;
  long lStack_40;
  size_t sStack_38;
  
  uVar2 = (this->m_state->pos).super_LineCol.offset;
  pcVar9 = (this->m_buf).str;
  uVar8 = (this->m_buf).len;
  this_00 = &this->m_state->line_contents;
  if (uVar8 <= uVar2) {
    full__00.str = pcVar9 + uVar8;
    full__00.len = 0;
    stripped_.len = 0;
    stripped_.str = full__00.str;
    LineContents::reset(this_00,full__00,stripped_);
    return;
  }
  if (uVar8 < uVar2) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    cStack_60 = to_csubstr(
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                          );
    bStack_78.str._0_4_ = 0;
    bStack_78.str._4_4_ = 0;
    bStack_78.len._0_4_ = 0x767c;
    bStack_78.len._4_4_ = 0;
    uStack_68 = 0;
    (*(code *)PTR_error_impl_00231548)
              ("check failed: offset <= buf.len",0x1f,(anonymous_namespace)::s_default_callbacks);
  }
  lStack_40 = uVar2 - uVar8;
  if (uVar8 <= uVar2) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    handle_error(0x1e7ac6,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14c3,"i >= 0 && i < len");
  }
  s_ = pcVar9 + uVar2;
  pcVar9 = pcVar9 + uVar8;
  for (uVar6 = 0; ((pcVar1 = s_ + uVar6, pcVar1 < pcVar9 && (*pcVar1 != '\n')) && (*pcVar1 != '\r'))
      ; uVar6 = uVar6 + 1) {
  }
  uStack_50 = uVar8;
  pLStack_48 = this_00;
  if (pcVar1 < s_) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    cStack_60 = to_csubstr(
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                          );
    bStack_78.str._0_4_ = 0;
    bStack_78.str._4_4_ = 0;
    bStack_78.len._0_4_ = 0x7682;
    bStack_78.len._4_4_ = 0;
    uStack_68 = 0;
    (*(code *)PTR_error_impl_00231548)
              ("check failed: e >= b",0x14,(anonymous_namespace)::s_default_callbacks);
  }
  lVar7 = uVar2 - uStack_50;
  if (uStack_50 <= uVar2 && lVar7 != 0) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    handle_error(0x1e7ac6,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153a,"first >= 0 && first <= len");
  }
  if (uVar6 != 0xffffffffffffffff && uStack_50 < uVar6) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    handle_error(0x1e7ac6,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
  }
  sStack_38 = uStack_50 - uVar2;
  uVar8 = uVar6;
  if (uVar6 == 0xffffffffffffffff) {
    uVar8 = sStack_38;
  }
  if (uVar6 != 0 && uStack_50 < uVar2 + uVar8) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    handle_error(0x1e7ac6,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
  }
  basic_substring<const_char>::basic_substring(&bStack_78,s_,uVar8);
  uVar8 = uStack_50;
  lStack_40 = lStack_40 + uVar6;
  if ((lStack_40 != 0) && (uVar5 = (ulong)(s_[uVar6] == '\r'), lVar7 + uVar5 + uVar6 != 0)) {
    pcVar9 = pcVar1 + (s_[uVar6 + uVar5] == '\n') + uVar5;
  }
  stripped__00.str._4_4_ = bStack_78.str._4_4_;
  stripped__00.str._0_4_ = bStack_78.str._0_4_;
  stripped__00.len._4_4_ = bStack_78.len._4_4_;
  stripped__00.len._0_4_ = (undefined4)bStack_78.len;
  uVar6 = (long)pcVar9 - (long)s_;
  if (pcVar9 < s_) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    cStack_60 = to_csubstr(
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                          );
    bStack_78.str._0_4_ = 0;
    bStack_78.str._4_4_ = 0;
    bStack_78.len._0_4_ = 0x7689;
    bStack_78.len._4_4_ = 0;
    uStack_68 = 0;
    (*(code *)PTR_error_impl_00231548)
              ("check failed: e >= b",0x14,(anonymous_namespace)::s_default_callbacks);
  }
  if (uVar8 < uVar2) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    handle_error(0x1e7ac6,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153a,"first >= 0 && first <= len");
  }
  if (uVar6 != 0xffffffffffffffff && uVar8 < uVar6) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    handle_error(0x1e7ac6,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
  }
  len_ = sStack_38;
  if (uVar6 != 0xffffffffffffffff) {
    len_ = uVar6;
  }
  if ((uVar8 < uVar2 + len_) && (pcVar9 != s_)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    handle_error(0x1e7ac6,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
  }
  basic_substring<const_char>::basic_substring(&bStack_78,s_,len_);
  full_.str._4_4_ = bStack_78.str._4_4_;
  full_.str._0_4_ = bStack_78.str._0_4_;
  full_.len._0_4_ = (undefined4)bStack_78.len;
  full_.len._4_4_ = bStack_78.len._4_4_;
  LineContents::reset(pLStack_48,full_,stripped__00);
  return;
}

Assistant:

void Parser::_scan_line()
{
    if(m_state->pos.offset >= m_buf.len)
    {
        m_state->line_contents.reset(m_buf.last(0), m_buf.last(0));
        return;
    }
    m_state->line_contents.reset_with_next_line(m_buf, m_state->pos.offset);
}